

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QSynth.cpp
# Opt level: O0

void __thiscall
QSynth::setSynthProfile(QSynth *this,SynthProfile *synthProfile,QString *useSynthProfileName)

{
  QString *useSynthProfileName_local;
  SynthProfile *synthProfile_local;
  QSynth *this_local;
  
  QString::operator=(&this->synthProfileName,(QString *)useSynthProfileName);
  QDir::operator=(&this->romDir,&synthProfile->romDir);
  QString::operator=(&this->controlROMFileName,(QString *)&synthProfile->controlROMFileName);
  QString::operator=(&this->controlROMFileName2,(QString *)&synthProfile->controlROMFileName2);
  QString::operator=(&this->pcmROMFileName,(QString *)&synthProfile->pcmROMFileName);
  QString::operator=(&this->pcmROMFileName2,(QString *)&synthProfile->pcmROMFileName2);
  setAnalogOutputMode(this,synthProfile->analogOutputMode);
  setRendererType(this,synthProfile->rendererType);
  setPartialCount(this,synthProfile->partialCount);
  setReverbCompatibilityMode(this,synthProfile->reverbCompatibilityMode);
  setMIDIDelayMode(this,synthProfile->midiDelayMode);
  setDACInputMode(this,synthProfile->emuDACInputMode);
  setOutputGain(this,synthProfile->outputGain);
  setReverbOutputGain(this,synthProfile->reverbOutputGain);
  setReverbOverridden(this,(bool)(synthProfile->reverbOverridden & 1));
  if ((synthProfile->reverbOverridden & 1U) != 0) {
    setReverbSettings(this,synthProfile->reverbMode,synthProfile->reverbTime,
                      synthProfile->reverbLevel);
    setReverbEnabled(this,(bool)(synthProfile->reverbEnabled & 1));
  }
  setReversedStereoEnabled(this,(bool)(synthProfile->reversedStereoEnabled & 1));
  setNiceAmpRampEnabled(this,(bool)(synthProfile->niceAmpRamp & 1));
  setNicePanningEnabled(this,(bool)(synthProfile->nicePanning & 1));
  setNicePartialMixingEnabled(this,(bool)(synthProfile->nicePartialMixing & 1));
  setInitialMIDIChannelsAssignment(this,(bool)(synthProfile->engageChannel1OnOpen & 1));
  setDisplayCompatibilityMode(this,synthProfile->displayCompatibilityMode);
  return;
}

Assistant:

void QSynth::setSynthProfile(const SynthProfile &synthProfile, QString useSynthProfileName) {
	synthProfileName = useSynthProfileName;

	// Settings below do not take effect before re-open.
	romDir = synthProfile.romDir;
	controlROMFileName = synthProfile.controlROMFileName;
	controlROMFileName2 = synthProfile.controlROMFileName2;
	pcmROMFileName = synthProfile.pcmROMFileName;
	pcmROMFileName2 = synthProfile.pcmROMFileName2;
	setAnalogOutputMode(synthProfile.analogOutputMode);
	setRendererType(synthProfile.rendererType);
	setPartialCount(synthProfile.partialCount);

	// Settings below take effect immediately.
	setReverbCompatibilityMode(synthProfile.reverbCompatibilityMode);
	setMIDIDelayMode(synthProfile.midiDelayMode);
	setDACInputMode(synthProfile.emuDACInputMode);
	setOutputGain(synthProfile.outputGain);
	setReverbOutputGain(synthProfile.reverbOutputGain);
	setReverbOverridden(synthProfile.reverbOverridden);
	if (synthProfile.reverbOverridden) {
		setReverbSettings(synthProfile.reverbMode, synthProfile.reverbTime, synthProfile.reverbLevel);
		setReverbEnabled(synthProfile.reverbEnabled);
	}
	setReversedStereoEnabled(synthProfile.reversedStereoEnabled);
	setNiceAmpRampEnabled(synthProfile.niceAmpRamp);
	setNicePanningEnabled(synthProfile.nicePanning);
	setNicePartialMixingEnabled(synthProfile.nicePartialMixing);
	setInitialMIDIChannelsAssignment(synthProfile.engageChannel1OnOpen);
	setDisplayCompatibilityMode(synthProfile.displayCompatibilityMode);
}